

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_applyWithExpandedArguments
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  size_t argumentCount_00;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_e0;
  sysbvm_functionCallFrameStack_t local_d8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    argumentCount_00 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    argumentCount_00 = 0;
  }
  memset(&local_d8,0,0xb0);
  local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_f8._12_4_ = 0;
  local_e8 = 0x11;
  paStack_e0 = &local_d8.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_f8);
  sysbvm_functionCallFrameStack_begin(context,&local_d8,*arguments,argumentCount_00,2);
  if (argumentCount_00 != 0) {
    sVar3 = 0;
    do {
      uVar1 = arguments[1];
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
      }
      else {
        sVar2 = 0;
      }
      sysbvm_functionCallFrameStack_push(&local_d8,sVar2);
      sVar3 = sVar3 + 1;
    } while (argumentCount_00 != sVar3);
  }
  sysbvm_stackFrame_popRecord(&local_f8);
  sVar2 = sysbvm_function_apply
                    (context,local_d8.gcRoots.function,local_d8.expectedArgumentCount,
                     local_d8.gcRoots.applicationArguments,local_d8.applicationFlags);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_applyWithExpandedArguments(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t callArgumentCount = sysbvm_array_getSize(*argumentList);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    for(size_t i = 0; i < callArgumentCount; ++i)
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}